

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_ObjDelay(Gia_Man_t *pNew,int iObj,int nLutSize,Vec_Int_t *vDelay)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int d1_1;
  int d0_1;
  int d2;
  int d1;
  int d0;
  int Delay;
  Vec_Int_t *vDelay_local;
  int nLutSize_local;
  int iObj_local;
  Gia_Man_t *pNew_local;
  
  d1 = Vec_IntEntry(vDelay,iObj);
  if (d1 == 0) {
    iVar1 = Gia_ObjIsMuxId(pNew,iObj);
    if (iVar1 == 0) {
      pGVar4 = Gia_ManObj(pNew,iObj);
      iVar1 = Gia_ObjFaninId0(pGVar4,iObj);
      iVar1 = Vec_IntEntry(vDelay,iVar1);
      pGVar4 = Gia_ManObj(pNew,iObj);
      iVar2 = Gia_ObjFaninId1(pGVar4,iObj);
      iVar2 = Vec_IntEntry(vDelay,iVar2);
      d1 = Str_Delay2(iVar1,iVar2,nLutSize);
    }
    else {
      pGVar4 = Gia_ManObj(pNew,iObj);
      iVar1 = Gia_ObjFaninId0(pGVar4,iObj);
      iVar1 = Vec_IntEntry(vDelay,iVar1);
      pGVar4 = Gia_ManObj(pNew,iObj);
      iVar2 = Gia_ObjFaninId1(pGVar4,iObj);
      iVar2 = Vec_IntEntry(vDelay,iVar2);
      iVar3 = Gia_ObjFaninId2(pNew,iObj);
      iVar3 = Vec_IntEntry(vDelay,iVar3);
      d1 = Str_Delay3(iVar1,iVar2,iVar3,nLutSize);
    }
    Vec_IntWriteEntry(vDelay,iObj,d1);
  }
  return d1;
}

Assistant:

static inline int Str_ObjDelay( Gia_Man_t * pNew, int iObj, int nLutSize, Vec_Int_t * vDelay )
{
    int Delay = Vec_IntEntry( vDelay, iObj );
    if ( Delay == 0 )
    {
        if ( Gia_ObjIsMuxId(pNew, iObj) )
        {
            int d0 = Vec_IntEntry( vDelay, Gia_ObjFaninId0(Gia_ManObj(pNew, iObj), iObj) );
            int d1 = Vec_IntEntry( vDelay, Gia_ObjFaninId1(Gia_ManObj(pNew, iObj), iObj) );
            int d2 = Vec_IntEntry( vDelay, Gia_ObjFaninId2(pNew, iObj) );
            Delay = Str_Delay3( d0, d1, d2, nLutSize );
        }
        else
        {
            int d0 = Vec_IntEntry( vDelay, Gia_ObjFaninId0(Gia_ManObj(pNew, iObj), iObj) );
            int d1 = Vec_IntEntry( vDelay, Gia_ObjFaninId1(Gia_ManObj(pNew, iObj), iObj) );
            Delay = Str_Delay2( d0, d1, nLutSize );
        }
        Vec_IntWriteEntry( vDelay, iObj, Delay );
    }
    return Delay;
}